

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

bool el::base::utils::File::createPath(string *path)

{
  __nlink_t *p_Var1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  string builtPath;
  stat local_b0;
  
  if (path->_M_string_length == 0) {
    bVar4 = false;
  }
  else {
    pcVar3 = (path->_M_dataplus)._M_p;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      iVar2 = stat(pcVar3,&local_b0);
      if (iVar2 == 0) {
        return true;
      }
      pcVar3 = (path->_M_dataplus)._M_p;
    }
    p_Var1 = &local_b0.st_nlink;
    local_b0.st_ino = 0;
    local_b0.st_nlink._0_1_ = 0;
    local_b0.st_dev = (__dev_t)p_Var1;
    if (*pcVar3 == '/') {
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)0x0,0x12134c);
    }
    pcVar3 = strtok(pcVar3,"/");
    if (pcVar3 == (char *)0x0) {
      bVar4 = false;
    }
    else {
      do {
        std::__cxx11::string::append((char *)&local_b0);
        std::__cxx11::string::append((char *)&local_b0);
        iVar2 = mkdir((char *)local_b0.st_dev,0x1fb);
        pcVar3 = strtok((char *)0x0,"/");
      } while (pcVar3 != (char *)0x0);
      bVar4 = iVar2 != -1;
    }
    if ((__nlink_t *)local_b0.st_dev != p_Var1) {
      operator_delete((void *)local_b0.st_dev);
    }
  }
  return bVar4;
}

Assistant:

static inline std::string getCurrentThreadId(void) {
    std::stringstream ss;
    ss << std::this_thread::get_id();
    return ss.str();
}